

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeVar(bool is_const)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_20;
  undefined1 local_11;
  Ref RStack_10;
  bool is_const_local;
  
  local_11 = is_const;
  local_20 = makeRawArray(2);
  pVVar1 = Ref::operator->(&local_20);
  RVar2 = makeRawString((IString *)&VAR);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawArray(0);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  Ref::Ref(&stack0xfffffffffffffff0,pVVar1);
  return (Ref)RStack_10.inst;
}

Assistant:

static Ref makeVar(bool is_const = false) {
    return &makeRawArray(2)
              ->push_back(makeRawString(VAR))
              .push_back(makeRawArray());
  }